

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

void __thiscall
Js::JavascriptPromiseReactionTaskFunction::MarkVisitKindSpecificPtrs
          (JavascriptPromiseReactionTaskFunction *this,SnapshotExtractor *extractor)

{
  Var var;
  
  var = (this->argument).ptr;
  if ((var != (Var)0x0) && ((this->reaction).ptr != (JavascriptPromiseReaction *)0x0)) {
    TTD::SnapshotExtractor::MarkVisitVar(extractor,var);
    JavascriptPromiseReaction::MarkVisitPtrs((this->reaction).ptr,extractor);
    return;
  }
  TTDAbort_unrecoverable_error("Was not expecting this!!!");
}

Assistant:

void JavascriptPromiseReactionTaskFunction::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        TTDAssert(this->argument != nullptr && this->reaction != nullptr, "Was not expecting this!!!");

        extractor->MarkVisitVar(this->argument);

        this->reaction->MarkVisitPtrs(extractor);
    }